

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

QXmlStreamEntityDeclarations * __thiscall
QXmlStreamReader::entityDeclarations(QXmlStreamReader *this)

{
  QXmlStreamReaderPrivate *pQVar1;
  qsizetype qVar2;
  QList<QXmlStreamEntityDeclaration> *in_RDI;
  QXmlStreamReaderPrivate *d;
  QXmlStreamReaderPrivate *in_stack_00000028;
  QList<QXmlStreamEntityDeclaration> *this_00;
  
  this_00 = in_RDI;
  pQVar1 = d_func((QXmlStreamReader *)0x649ea8);
  qVar2 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::size
                    (&pQVar1->entityDeclarations);
  if (qVar2 != 0) {
    QXmlStreamReaderPrivate::resolveDtd(in_stack_00000028);
  }
  QList<QXmlStreamEntityDeclaration>::QList(this_00,in_RDI);
  return this_00;
}

Assistant:

QXmlStreamEntityDeclarations QXmlStreamReader::entityDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->entityDeclarations.size())
        const_cast<QXmlStreamReaderPrivate *>(d)->resolveDtd();
    return d->publicEntityDeclarations;
}